

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.h
# Opt level: O3

void __thiscall CGI::CGI(CGI *this,CharContent *path,CharContent *name,int connfd)

{
  ulong uVar1;
  char *pcVar2;
  
  this->_vptr_CGI = (_func_int **)&PTR__CGI_00117d38;
  (this->_path)._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  (this->_path).npos = 0xffffffffffffffff;
  uVar1 = path->m_length;
  pcVar2 = (char *)operator_new__(uVar1);
  (this->_path).m = pcVar2;
  (this->_path).size = path->size;
  (this->_path).m_length = uVar1;
  memset(pcVar2,0,uVar1);
  memmove(pcVar2,path->m,uVar1);
  (this->_name)._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  (this->_name).npos = 0xffffffffffffffff;
  uVar1 = name->m_length;
  pcVar2 = (char *)operator_new__(uVar1);
  (this->_name).m = pcVar2;
  (this->_name).size = name->size;
  (this->_name).m_length = uVar1;
  memset(pcVar2,0,uVar1);
  memmove(pcVar2,name->m,uVar1);
  this->_connfd = connfd;
  return;
}

Assistant:

CGI(const CharContent &path,const CharContent &name,int connfd):_path(path),_name(name),_connfd(connfd){}